

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_Plugin_DeprecatedEdition_Test::
TestBody(CommandLineInterfaceTest_Plugin_DeprecatedEdition_Test *this)

{
  string_view local_88 [2];
  allocator<char> local_61;
  string local_60;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_Plugin_DeprecatedEdition_Test *local_10;
  CommandLineInterfaceTest_Plugin_DeprecatedEdition_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"\n    edition = \"2023\";\n    message Foo {\n      int32 i = 1;\n    }\n  "
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"high_minimum")
  ;
  CommandLineInterfaceTest::SetMockGeneratorTestCase(&this->super_CommandLineInterfaceTest,local_40)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "protocol_compiler --proto_path=$tmpdir foo.proto --plug_out=$tmpdir",&local_61);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_88,
             "foo.proto: is a file using edition 2023, which isn\'t supported by code generator prefix-gen-plug.  Please upgrade your file to at least edition 99997_TEST_ONLY."
            );
  CommandLineInterfaceTester::ExpectErrorSubstring((CommandLineInterfaceTester *)this,local_88[0]);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_DeprecatedEdition) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2023";
    message Foo {
      int32 i = 1;
    }
  )schema");

  SetMockGeneratorTestCase("high_minimum");
  Run("protocol_compiler "
      "--proto_path=$tmpdir foo.proto --plug_out=$tmpdir");

  ExpectErrorSubstring(
      "foo.proto: is a file using edition 2023, which isn't supported by code "
      "generator prefix-gen-plug.  Please upgrade your file to at least "
      "edition 99997_TEST_ONLY.");
}